

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcLits.c
# Opt level: O2

int Mvc_CoverWorstLiteral(Mvc_Cover_t *pCover,Mvc_Cube_t *pMask)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  Mvc_Cube_t *pMVar6;
  uint uVar7;
  uint uVar8;
  
  uVar4 = 0;
  uVar1 = pCover->nBits;
  if (pCover->nBits < 1) {
    uVar1 = 0;
  }
  uVar7 = 1000000;
  uVar5 = 0xffffffff;
  while( true ) {
    uVar3 = (uint)uVar4;
    if (uVar3 == uVar1) break;
    if ((pMask == (Mvc_Cube_t *)0x0) || ((pMask->pData[uVar4 >> 5] >> (uVar3 & 0x1f) & 1) != 0)) {
      uVar8 = 0;
      pMVar6 = (Mvc_Cube_t *)&pCover->lCubes;
      while (pMVar6 = pMVar6->pNext, pMVar6 != (Mvc_Cube_t *)0x0) {
        uVar8 = uVar8 + ((pMVar6->pData[uVar4 >> 5] >> (uVar3 & 0x1f) & 1) != 0);
      }
      if (1 < uVar8 && (int)uVar8 < (int)uVar7) {
        uVar5 = uVar4;
        uVar7 = uVar8;
      }
    }
    uVar4 = (ulong)(uVar3 + 1);
  }
  iVar2 = -1;
  if ((int)uVar7 < 1000000) {
    iVar2 = (int)uVar5;
  }
  return iVar2;
}

Assistant:

int Mvc_CoverWorstLiteral( Mvc_Cover_t * pCover, Mvc_Cube_t * pMask )
{
    Mvc_Cube_t * pCube;
    int nWord, nBit;
    int i, iMin, nLitsMin, nLitsCur;
    int fUseFirst = 1;

    // go through each literal
    iMin = -1;
    nLitsMin = 1000000;
    for ( i = 0; i < pCover->nBits; i++ )
        if ( !pMask || Mvc_CubeBitValue(pMask,i) )
        {
            // get the word and bit of this literal
            nWord = Mvc_CubeWhichWord(i);
            nBit  = Mvc_CubeWhichBit(i);
            // go through all the cubes
            nLitsCur = 0;
            Mvc_CoverForEachCube( pCover, pCube )
                if ( pCube->pData[nWord] & (1<<nBit) )
                    nLitsCur++;

            // skip the literal that does not occur or occurs once
            if ( nLitsCur < 2 )
                continue;

            // check if this is the best literal
            if ( fUseFirst )
            {
                if ( nLitsMin > nLitsCur )
                {
                    nLitsMin = nLitsCur;
                    iMin = i;
                }
            }
            else
            {
                if ( nLitsMin >= nLitsCur )
                {
                    nLitsMin = nLitsCur;
                    iMin = i;
                }
            }
        }

    if ( nLitsMin < 1000000 )
        return iMin;
    return -1;
}